

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O0

void __thiscall xLearn::DMatrix::Reset(DMatrix *this)

{
  reference ppvVar1;
  undefined8 *in_RDI;
  int i;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffa8;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffb0;
  undefined1 local_40 [28];
  uint local_24;
  undefined1 local_20 [32];
  
  *(undefined1 *)(in_RDI + 0xc) = 1;
  *in_RDI = 0;
  in_RDI[1] = 0;
  memset(local_20,0,0x18);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x18dca1);
  std::vector<float,_std::allocator<float>_>::swap
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffffb0);
  for (local_24 = 0; local_24 < *(uint *)(in_RDI + 2); local_24 = local_24 + 1) {
    ppvVar1 = std::
              vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ::operator[]((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                            *)(in_RDI + 3),(long)(int)local_24);
    if (*ppvVar1 != (value_type)0x0) {
      STLDeleteElementsAndClear<std::vector<std::vector<xLearn::Node,std::allocator<xLearn::Node>>*,std::allocator<std::vector<xLearn::Node,std::allocator<xLearn::Node>>*>>>
                ((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                  *)in_stack_ffffffffffffffb0);
    }
  }
  memset(local_40,0,0x18);
  std::
  vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ::vector((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
            *)0x18dd25);
  std::
  vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ::swap((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
          *)in_stack_ffffffffffffffb0,
         (vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
          *)in_stack_ffffffffffffffa8);
  std::
  vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ::~vector((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
             *)in_stack_ffffffffffffffb0);
  memset(&stack0xffffffffffffffa8,0,0x18);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x18dd5d);
  std::vector<float,_std::allocator<float>_>::swap
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffffb0);
  *(undefined4 *)(in_RDI + 2) = 0;
  *(undefined4 *)((long)in_RDI + 100) = 0;
  return;
}

Assistant:

void Reset() {
    this->has_label = true;
    this->hash_value_1 = 0;
    this->hash_value_2 = 0;
    // Delete Y
    std::vector<real_t>().swap(this->Y);
    // Delete Node
    for (int i = 0; i < this->row_length; ++i) {
      if ((this->row)[i] != nullptr) {
        STLDeleteElementsAndClear(&(this->row));
      }
    }
    // Delete SparseRow
    std::vector<SparseRow*>().swap(this->row);
    // Delete norm
    std::vector<real_t>().swap(this->norm);
    this->row_length = 0;
    this->pos = 0;
  }